

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void output_stored_text(void)

{
  FILE *__stream;
  FILE *__stream_00;
  uint uVar1;
  int local_24;
  int state;
  FILE *out;
  FILE *in;
  int c;
  
  local_24 = 1;
  fclose((FILE *)text_file);
  text_file = (FILE *)fopen(text_file_name,"r");
  if ((FILE *)text_file == (FILE *)0x0) {
    open_error(text_file_name);
  }
  __stream = text_file;
  in._4_4_ = getc((FILE *)text_file);
  __stream_00 = code_file;
  if (in._4_4_ != -1) {
    do {
      if (in._4_4_ == 10) {
        if (local_24 != 2) {
          local_24 = 1;
          outline = outline + 1;
          goto LAB_00111b3c;
        }
        uVar1 = outline + 2;
        outline = outline + 1;
        fprintf((FILE *)__stream_00,line_format + 1,(ulong)uVar1,code_file_name);
        local_24 = 1;
      }
      else {
        if ((local_24 == 1) && (in._4_4_ == 0x23)) {
          local_24 = 2;
        }
        else {
          local_24 = 0;
        }
LAB_00111b3c:
        putc(in._4_4_,(FILE *)__stream_00);
      }
      in._4_4_ = getc((FILE *)__stream);
    } while (in._4_4_ != -1);
    if (lflag == '\0') {
      uVar1 = outline + 2;
      outline = outline + 1;
      fprintf((FILE *)__stream_00,line_format,(ulong)uVar1,code_file_name);
    }
  }
  return;
}

Assistant:

void output_stored_text()
{
    register int c;
    register FILE *in, *out;
    register int state;	/* 0=middle of line, 1=start of line, 2=seen '#' */

    state = 1;
    fclose(text_file);
    text_file = fopen(text_file_name, "r");
    if (text_file == NULL)
	open_error(text_file_name);
    in = text_file;
    if ((c = getc(in)) == EOF)
	return;
    out = code_file;
    do {
	if (c == '\n') {
	    ++outline;
	    if (state == 2) {
		fprintf(out, line_format+1, outline + 1, code_file_name);
		state = 1;
		continue; }
	    state = 1; }
	else if (state == 1 && c == '#')
	    state = 2;
	else
	    state = 0;
	putc(c, out);
    } while ((c = getc(in)) != EOF);
    if (!lflag)
	fprintf(out, line_format, ++outline + 1, code_file_name);
}